

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddExact.c
# Opt level: O0

DdHalfWord ** getMatrix(int rows,int cols)

{
  DdHalfWord *pDVar1;
  int local_24;
  int i;
  DdHalfWord **matrix;
  int cols_local;
  int rows_local;
  
  if (cols * rows == 0) {
    _cols_local = (DdHalfWord **)0x0;
  }
  else {
    _cols_local = (DdHalfWord **)malloc((long)rows << 3);
    if (_cols_local == (DdHalfWord **)0x0) {
      _cols_local = (DdHalfWord **)0x0;
    }
    else {
      pDVar1 = (DdHalfWord *)malloc((long)(cols * rows) << 2);
      *_cols_local = pDVar1;
      if (*_cols_local == (DdHalfWord *)0x0) {
        if (_cols_local != (DdHalfWord **)0x0) {
          free(_cols_local);
        }
        _cols_local = (DdHalfWord **)0x0;
      }
      else {
        for (local_24 = 1; local_24 < rows; local_24 = local_24 + 1) {
          _cols_local[local_24] = _cols_local[local_24 + -1] + cols;
        }
      }
    }
  }
  return _cols_local;
}

Assistant:

static DdHalfWord **
getMatrix(
  int  rows /* number of rows */,
  int  cols /* number of columns */)
{
    DdHalfWord **matrix;
    int i;

    if (cols*rows == 0) return(NULL);
    matrix = ABC_ALLOC(DdHalfWord *, rows);
    if (matrix == NULL) return(NULL);
    matrix[0] = ABC_ALLOC(DdHalfWord, cols*rows);
    if (matrix[0] == NULL) {
        ABC_FREE(matrix);
        return(NULL);
    }
    for (i = 1; i < rows; i++) {
        matrix[i] = matrix[i-1] + cols;
    }
    return(matrix);

}